

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syslog.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  LogSyslog *this;
  
  this = (LogSyslog *)operator_new(8);
  liblogger::LogSyslog::LogSyslog(this);
  liblogger::LogManager::Add((ILogger *)this);
  examples();
  liblogger::LogManager::RemoveAll();
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	LogManager::Add(new LogSyslog());

	examples();

	LogManager::RemoveAll();
	return 0;
}